

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O3

psa_status_t psa_generate_random(uint8_t *output,size_t output_size)

{
  int ret;
  psa_status_t pVar1;
  
  if ((global_data._1392_1_ & 1) == 0) {
    return -0x89;
  }
  if (0x400 < output_size) {
    do {
      ret = mbedtls_ctr_drbg_random(&global_data.ctr_drbg,output,0x400);
      if (ret != 0) goto LAB_00114103;
      output = output + 0x400;
      output_size = output_size - 0x400;
    } while (0x400 < output_size);
  }
  ret = mbedtls_ctr_drbg_random(&global_data.ctr_drbg,output,output_size);
LAB_00114103:
  pVar1 = mbedtls_to_psa_error(ret);
  return pVar1;
}

Assistant:

psa_status_t psa_generate_random( uint8_t *output,
                                  size_t output_size )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    GUARD_MODULE_INITIALIZED;

    while( output_size > MBEDTLS_CTR_DRBG_MAX_REQUEST )
    {
        ret = mbedtls_ctr_drbg_random( &global_data.ctr_drbg,
                                       output,
                                       MBEDTLS_CTR_DRBG_MAX_REQUEST );
        if( ret != 0 )
            return( mbedtls_to_psa_error( ret ) );
        output += MBEDTLS_CTR_DRBG_MAX_REQUEST;
        output_size -= MBEDTLS_CTR_DRBG_MAX_REQUEST;
    }

    ret = mbedtls_ctr_drbg_random( &global_data.ctr_drbg, output, output_size );
    return( mbedtls_to_psa_error( ret ) );
}